

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O2

void __thiscall FGLRenderer::BloomScene(FGLRenderer *this)

{
  FGLRenderBuffers *pFVar1;
  FGLRenderBuffers *pFVar2;
  float blurAmount;
  int sampleCount;
  long lVar3;
  FGLPostProcessState savedState;
  
  if ((gl_bloom.Value) && (gl_fixedcolormap == 0)) {
    FString::FString((FString *)&savedState,"BloomScene");
    FGLDebug::PushGroup((FString *)&savedState);
    FString::~FString((FString *)&savedState);
    FGLPostProcessState::FGLPostProcessState(&savedState);
    sampleCount = gl_bloom_kernel_size.Value;
    blurAmount = gl_bloom_amount.Value;
    pFVar1 = this->mBuffers;
    (*_ptrc_glBindFramebuffer)(0x8d40,pFVar1->BloomLevels[0].VFramebuffer);
    (*_ptrc_glViewport)(0,0,pFVar1->BloomLevels[0].Width,pFVar1->BloomLevels[0].Height);
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    FBloomExtractShader::Bind(this->mBloomExtractShader);
    FBufferedUniformSampler::Set(&this->mBloomExtractShader->SceneTexture,0);
    FBufferedUniform1f::Set(&this->mBloomExtractShader->Exposure,this->mCameraExposure);
    FBufferedUniform2f::Set
              (&this->mBloomExtractShader->Scale,
               (float)(this->mSceneViewport).width / (float)(this->mScreenViewport).width,
               (float)(this->mSceneViewport).height / (float)(this->mScreenViewport).height);
    FBufferedUniform2f::Set
              (&this->mBloomExtractShader->Offset,
               (float)(this->mSceneViewport).left / (float)(this->mScreenViewport).width,
               (float)(this->mSceneViewport).top / (float)(this->mScreenViewport).height);
    RenderScreenQuad(this);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2600);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2600);
    lVar3 = 0;
    while (lVar3 + 0x18 != 0x60) {
      pFVar2 = this->mBuffers;
      FBlurShader::BlurHorizontal
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar2->BloomLevels[0].VTexture + lVar3),
                 *(GLuint *)((long)&pFVar2->BloomLevels[0].HFramebuffer + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[0].Width + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[0].Height + lVar3));
      FBlurShader::BlurVertical
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar2->BloomLevels[0].HTexture + lVar3),
                 *(GLuint *)((long)&pFVar2->BloomLevels[1].VFramebuffer + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[1].Width + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[1].Height + lVar3));
      lVar3 = lVar3 + 0x18;
    }
    lVar3 = 0;
    while (lVar3 + -0x18 != -0x60) {
      pFVar2 = this->mBuffers;
      FBlurShader::BlurHorizontal
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar2->BloomLevels[3].VTexture + lVar3),
                 *(GLuint *)((long)&pFVar2->BloomLevels[3].HFramebuffer + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[3].Width + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[3].Height + lVar3));
      FBlurShader::BlurVertical
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar2->BloomLevels[3].HTexture + lVar3),
                 *(GLuint *)((long)&pFVar2->BloomLevels[3].VFramebuffer + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[3].Width + lVar3),
                 *(int *)((long)&pFVar2->BloomLevels[3].Height + lVar3));
      (*_ptrc_glBindFramebuffer)
                (0x8d40,*(GLuint *)((long)&pFVar2->BloomLevels[2].VFramebuffer + lVar3));
      (*_ptrc_glViewport)(0,0,*(GLsizei *)((long)&pFVar2->BloomLevels[2].Width + lVar3),
                          *(GLsizei *)((long)&pFVar2->BloomLevels[2].Height + lVar3));
      (*_ptrc_glActiveTexture)(0x84c0);
      (*_ptrc_glBindTexture)(0xde1,*(GLuint *)((long)&pFVar2->BloomLevels[3].VTexture + lVar3));
      (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
      (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
      FBloomCombineShader::Bind(this->mBloomCombineShader);
      FBufferedUniformSampler::Set(&this->mBloomCombineShader->BloomTexture,0);
      RenderScreenQuad(this);
      lVar3 = lVar3 + -0x18;
    }
    FBlurShader::BlurHorizontal
              (this->mBlurShader,this,blurAmount,sampleCount,pFVar1->BloomLevels[0].VTexture,
               pFVar1->BloomLevels[0].HFramebuffer,pFVar1->BloomLevels[0].Width,
               pFVar1->BloomLevels[0].Height);
    FBlurShader::BlurVertical
              (this->mBlurShader,this,blurAmount,sampleCount,pFVar1->BloomLevels[0].HTexture,
               pFVar1->BloomLevels[0].VFramebuffer,pFVar1->BloomLevels[0].Width,
               pFVar1->BloomLevels[0].Height);
    FGLRenderBuffers::BindCurrentFB(this->mBuffers);
    (*_ptrc_glViewport)((this->mSceneViewport).left,(this->mSceneViewport).top,
                        (this->mSceneViewport).width,(this->mSceneViewport).height);
    (*_ptrc_glEnable)(0xbe2);
    (*_ptrc_glBlendEquation)(0x8006);
    (*_ptrc_glBlendFunc)(1,1);
    (*_ptrc_glActiveTexture)(0x84c0);
    (*_ptrc_glBindTexture)(0xde1,pFVar1->BloomLevels[0].VTexture);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    FBloomCombineShader::Bind(this->mBloomCombineShader);
    FBufferedUniformSampler::Set(&this->mBloomCombineShader->BloomTexture,0);
    RenderScreenQuad(this);
    (*_ptrc_glViewport)((this->mScreenViewport).left,(this->mScreenViewport).top,
                        (this->mScreenViewport).width,(this->mScreenViewport).height);
    FGLDebug::PopGroup();
    FGLPostProcessState::~FGLPostProcessState(&savedState);
  }
  return;
}

Assistant:

void FGLRenderer::BloomScene()
{
	// Only bloom things if enabled and no special fixed light mode is active
	if (!gl_bloom || gl_fixedcolormap != CM_DEFAULT)
		return;

	FGLDebug::PushGroup("BloomScene");

	FGLPostProcessState savedState;

	const float blurAmount = gl_bloom_amount;
	int sampleCount = gl_bloom_kernel_size;

	const auto &level0 = mBuffers->BloomLevels[0];

	// Extract blooming pixels from scene texture:
	glBindFramebuffer(GL_FRAMEBUFFER, level0.VFramebuffer);
	glViewport(0, 0, level0.Width, level0.Height);
	mBuffers->BindCurrentTexture(0);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	mBloomExtractShader->Bind();
	mBloomExtractShader->SceneTexture.Set(0);
	mBloomExtractShader->Exposure.Set(mCameraExposure);
	mBloomExtractShader->Scale.Set(mSceneViewport.width / (float)mScreenViewport.width, mSceneViewport.height / (float)mScreenViewport.height);
	mBloomExtractShader->Offset.Set(mSceneViewport.left / (float)mScreenViewport.width, mSceneViewport.top / (float)mScreenViewport.height);
	RenderScreenQuad();
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	// Blur and downscale:
	for (int i = 0; i < FGLRenderBuffers::NumBloomLevels - 1; i++)
	{
		const auto &level = mBuffers->BloomLevels[i];
		const auto &next = mBuffers->BloomLevels[i + 1];
		mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level.VTexture, level.HFramebuffer, level.Width, level.Height);
		mBlurShader->BlurVertical(this, blurAmount, sampleCount, level.HTexture, next.VFramebuffer, next.Width, next.Height);
	}

	// Blur and upscale:
	for (int i = FGLRenderBuffers::NumBloomLevels - 1; i > 0; i--)
	{
		const auto &level = mBuffers->BloomLevels[i];
		const auto &next = mBuffers->BloomLevels[i - 1];

		mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level.VTexture, level.HFramebuffer, level.Width, level.Height);
		mBlurShader->BlurVertical(this, blurAmount, sampleCount, level.HTexture, level.VFramebuffer, level.Width, level.Height);

		// Linear upscale:
		glBindFramebuffer(GL_FRAMEBUFFER, next.VFramebuffer);
		glViewport(0, 0, next.Width, next.Height);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, level.VTexture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		mBloomCombineShader->Bind();
		mBloomCombineShader->BloomTexture.Set(0);
		RenderScreenQuad();
	}

	mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level0.VTexture, level0.HFramebuffer, level0.Width, level0.Height);
	mBlurShader->BlurVertical(this, blurAmount, sampleCount, level0.HTexture, level0.VFramebuffer, level0.Width, level0.Height);

	// Add bloom back to scene texture:
	mBuffers->BindCurrentFB();
	glViewport(mSceneViewport.left, mSceneViewport.top, mSceneViewport.width, mSceneViewport.height);
	glEnable(GL_BLEND);
	glBlendEquation(GL_FUNC_ADD);
	glBlendFunc(GL_ONE, GL_ONE);
	glActiveTexture(GL_TEXTURE0);
	glBindTexture(GL_TEXTURE_2D, level0.VTexture);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	mBloomCombineShader->Bind();
	mBloomCombineShader->BloomTexture.Set(0);
	RenderScreenQuad();
	glViewport(mScreenViewport.left, mScreenViewport.top, mScreenViewport.width, mScreenViewport.height);

	FGLDebug::PopGroup();
}